

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_critbit.c
# Opt level: O1

void test_erase(CuTest *tc)

{
  int iVar1;
  char *pcVar2;
  critbit_tree cb;
  critbit_tree local_30;
  
  local_30.root = (void *)0x0;
  iVar1 = cb_erase(&local_30,"herpderp",9);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0x59,(char *)0x0,2,iVar1);
  cb_insert(&local_30,"herp",5);
  cb_insert(&local_30,"derp",5);
  iVar1 = cb_erase(&local_30,"herp",5);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0x5f,(char *)0x0,0,iVar1);
  pcVar2 = (char *)cb_find(&local_30,"herp",5);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0x62,(char *)0x0,(char *)0x0,pcVar2);
  pcVar2 = (char *)cb_find(&local_30,"derp",5);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             100,(char *)0x0,"derp",pcVar2);
  iVar1 = cb_erase(&local_30,"derp",5);
  CuAssertIntEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0x67,(char *)0x0,0,iVar1);
  CuAssertPtrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_critbit.c",
             0x68,(char *)0x0,(void *)0x0,local_30.root);
  cb_clear(&local_30);
  return;
}

Assistant:

static void test_erase(CuTest * tc)
{
  critbit_tree cb = CRITBIT_TREE();
  int result;
  const char * str;

  result = cb_erase_str(&cb, "herpderp");
  CuAssertIntEquals(tc, CB_NOTFOUND, result);

  result = cb_insert_str(&cb, "herp");
  result = cb_insert_str(&cb, "derp");

  result = cb_erase_str(&cb, "herp");
  CuAssertIntEquals(tc, CB_SUCCESS, result);

  str = cb_find_str(&cb, "herp");
  CuAssertStrEquals(tc, NULL, str);
  str = cb_find_str(&cb, "derp");
  CuAssertStrEquals(tc, "derp", str);

  result = cb_erase_str(&cb, "derp");
  CuAssertIntEquals(tc, CB_SUCCESS, result);
  CuAssertPtrEquals(tc, NULL, cb.root);

  cb_clear(&cb);
}